

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_untransformed_generic_rgb64(int count,QT_FT_Span *spans,void *userData)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QThreadPool *pQVar5;
  ulong uVar6;
  anon_class_48_9_5c990f07 *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  bool solidSource;
  int yoff;
  int xoff;
  int const_alpha;
  int image_height;
  int image_width;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_48_9_5c990f07 function;
  Operator op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  int iVar7;
  undefined4 in_stack_fffffffffffffe7c;
  int iVar8;
  QMessageLogger *in_stack_fffffffffffffe80;
  QThreadPool *this;
  int in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  anon_class_48_9_5c990f07 *this_00;
  undefined1 *local_120;
  int *local_118 [2];
  int local_108;
  int local_104;
  undefined1 local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  char local_e8 [32];
  int local_c8 [12];
  code *local_98;
  long local_78;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDX;
  memcpy(local_c8,&DAT_00bfdbd0,0xb0);
  getOperator((QSpanData *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
              (QT_FT_Span *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
              in_stack_fffffffffffffe94);
  if (local_78 == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiDrawHelper();
    anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb73cba);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe80,
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe74,(char *)in_stack_fffffffffffffe68,(char *)0xb73cd3);
      QMessageLogger::debug
                (local_e8,
                 "blend_untransformed_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit"
                );
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    blend_untransformed_generic((int)((ulong)in_RSI >> 0x20),(QT_FT_Span *)this_00,in_RDX);
  }
  else {
    iVar8 = in_RDX[3].image_width;
    iVar7 = in_RDX[3].const_alpha;
    iVar4 = *(int *)&in_RDX[4].data;
    iVar2 = qRound(5.93313453964707e-317);
    iVar2 = -iVar2;
    local_104 = qRound(5.93315825479807e-317);
    local_104 = -local_104;
    local_100 = false;
    if ((local_c8[0] == 3) && (local_100 = false, iVar4 == 0x100)) {
      local_100 = local_98 != destFetchRGB64;
    }
    memset(local_118,0xaa,0x30);
    local_118[0] = local_c8;
    iVar3 = (in_EDI + 0x20) / 0x40;
    local_108 = iVar2;
    local_fc = iVar7;
    local_f8 = iVar8;
    local_f4 = iVar4;
    pQVar5 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((1 < iVar3) && (2 < (int)qPixelLayouts[*(uint *)&in_RDX->op->destStore].bpp)) &&
       (pQVar5 != (QThreadPool *)0x0)) {
      this = pQVar5;
      QThread::currentThread();
      uVar6 = QThreadPool::contains((QThread *)pQVar5);
      if ((uVar6 & 1) == 0) {
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
        iVar8 = 0;
        for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
          iVar4 = (in_EDI - iVar8) / (iVar3 - iVar7);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4467:5),_true>
                    (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar8,iVar7),iVar4);
          iVar8 = iVar4 + iVar8;
        }
        QSemaphore::acquire((int)&local_120);
        QSemaphore::~QSemaphore((QSemaphore *)&local_120);
        goto LAB_00b73fa2;
      }
    }
    blend_untransformed_generic_rgb64::anon_class_48_9_5c990f07::operator()
              (this_00,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  }
LAB_00b73fa2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_generic_rgb64(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);
    if (!op.func64) {
        qCDebug(lcQtGuiDrawHelper, "blend_untransformed_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit");
        return blend_untransformed_generic(count, spans, userData);
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);
    const bool solidSource = op.mode == QPainter::CompositionMode_Source && const_alpha == 256 && op.destFetch64 != destFetchRGB64;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            const bool fetchDest = !solidSource || spans[c].coverage < 255;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    while (length) {
                        int l = qMin(BufferSize, length);
                        const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                        QRgba64 *dest = fetchDest ? op.destFetch64(buffer, data->rasterBuffer, x, spans[c].y, l) : buffer;
                        op.func64(dest, src, l, coverage);
                        if (op.destStore64)
                            op.destStore64(data->rasterBuffer, x, spans[c].y, dest, l);
                        x += l;
                        sx += l;
                        length -= l;
                    }
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}